

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpTestLog.c
# Opt level: O1

deBool qpTestLog_writeImage
                 (qpTestLog *log,char *name,char *description,qpImageCompressionMode compressionMode
                 ,qpImageFormat imageFormat,int width,int height,int stride,void *data)

{
  qpImageCompressionMode qVar1;
  deBool dVar2;
  png_byte **rowPointers;
  png_infop ppVar3;
  int iVar4;
  ulong uVar5;
  deUint8 *pdVar6;
  int iVar7;
  png_infop *pppVar8;
  int iVar9;
  deUint8 *data_00;
  bool bVar10;
  char widthStr [32];
  qpXmlAttribute attribs [8];
  char heightStr [32];
  size_t local_1c0;
  Buffer local_1a8;
  qpImageFormat local_184;
  char *local_180;
  png_infop local_178 [4];
  qpXmlAttribute local_158;
  char *local_138;
  undefined4 local_130;
  png_infop *local_128;
  undefined8 local_120;
  char *local_118;
  undefined4 local_110;
  char *local_108;
  undefined8 local_100;
  char *local_f8;
  undefined4 local_f0;
  char *local_e8;
  undefined8 local_e0;
  char *local_d8;
  undefined4 local_d0;
  char *local_c8;
  undefined8 local_c0;
  char *local_b8;
  undefined4 local_b0;
  char *local_a8;
  undefined8 local_a0;
  char local_58 [40];
  
  if ((log->flags & 1) != 0) {
    return 1;
  }
  local_1a8.capacity = 0;
  local_1a8.size = 0;
  local_1a8.data = (deUint8 *)0x0;
  qVar1 = QP_IMAGE_COMPRESSION_MODE_PNG;
  if (compressionMode != QP_IMAGE_COMPRESSION_MODE_BEST) {
    qVar1 = compressionMode;
  }
  local_1c0 = 0xffffffffffffffff;
  if (qVar1 == QP_IMAGE_COMPRESSION_MODE_PNG) {
    local_158.name = (char *)0x0;
    local_178[0] = (png_infop)0x0;
    rowPointers = (png_byte **)deMalloc((long)height << 3);
    if (rowPointers != (png_byte **)0x0) {
      if (0 < height) {
        iVar4 = 0;
        uVar5 = 0;
        do {
          rowPointers[uVar5] = (png_byte *)((long)data + (long)iVar4);
          uVar5 = uVar5 + 1;
          iVar4 = iVar4 + stride;
        } while ((uint)height != uVar5);
      }
      ppVar3 = (png_infop)0x0;
      local_158.name = (char *)png_create_write_struct("1.6.37",0,0,0);
      if ((png_structp)local_158.name != (png_structp)0x0) {
        ppVar3 = (png_infop)png_create_info_struct(local_158.name);
      }
      bVar10 = true;
      local_178[0] = ppVar3;
      if (ppVar3 != (png_infop)0x0 && (png_structp)local_158.name != (png_structp)0x0) {
        png_set_write_fn(local_158.name,&local_1a8,pngWriteData,pngFlushData);
        dVar2 = writeCompressedPNG((png_structp)local_158.name,local_178[0],rowPointers,width,height
                                   ,(uint)(imageFormat == QP_IMAGE_FORMAT_RGBA8888) * 4 + 2);
        bVar10 = dVar2 == 0;
      }
      if (((png_structp)local_158.name == (png_structp)0x0) || (local_178[0] == (png_infop)0x0)) {
        if ((png_structp)local_158.name != (png_structp)0x0) {
          pppVar8 = local_178;
          goto LAB_00214142;
        }
      }
      else {
        png_destroy_info_struct(local_158.name,local_178);
        pppVar8 = (png_infop *)0x0;
LAB_00214142:
        png_destroy_write_struct(&local_158,pppVar8);
      }
      deFree(rowPointers);
      if (!bVar10) {
        local_1c0 = local_1a8.size;
        qVar1 = QP_IMAGE_COMPRESSION_MODE_PNG;
        data_00 = local_1a8.data;
        goto LAB_00214195;
      }
    }
    qpPrintf("WARNING: PNG compression failed -- storing image uncompressed.\n");
    qVar1 = QP_IMAGE_COMPRESSION_MODE_NONE;
    data_00 = (deUint8 *)0x0;
  }
  else {
    data_00 = (deUint8 *)0x0;
  }
LAB_00214195:
  if (qVar1 != QP_IMAGE_COMPRESSION_MODE_PNG) {
    if (qVar1 != QP_IMAGE_COMPRESSION_MODE_NONE) {
      dVar2 = 0;
      qpPrintf("qpTestLog_writeImage(): Unknown compression mode: %s\n",
               s_qpImageCompressionModeMap[(int)qVar1].string);
      goto LAB_00214513;
    }
    iVar4 = (4 - (uint)(imageFormat == QP_IMAGE_FORMAT_RGB888)) * width;
    pdVar6 = (deUint8 *)data;
    local_184 = imageFormat;
    if (iVar4 == stride) {
LAB_002142e7:
      local_1c0 = (size_t)(iVar4 * height);
      bVar10 = true;
      data_00 = pdVar6;
    }
    else {
      dVar2 = Buffer_resize(&local_1a8,(long)(iVar4 * height));
      if (dVar2 != 0) {
        pdVar6 = data_00;
        if (0 < height) {
          uVar5 = (ulong)(uint)height;
          iVar7 = 0;
          iVar9 = 0;
          local_180 = description;
          do {
            memcpy(local_1a8.data + iVar7,(void *)((long)data + (long)iVar9),(long)iVar4);
            iVar9 = iVar9 + stride;
            iVar7 = iVar7 + iVar4;
            uVar5 = uVar5 - 1;
            description = local_180;
          } while (uVar5 != 0);
        }
        goto LAB_002142e7;
      }
      bVar10 = false;
      qpPrintf("ERROR: Failed to pack pixels for writing.\n");
      deFree(local_1a8.data);
      local_1a8.capacity = 0;
      local_1a8.size = 0;
      local_1a8.data = (deUint8 *)0x0;
    }
    imageFormat = local_184;
    if (!bVar10) {
      return 0;
    }
  }
  deSprintf((char *)local_178,0x20,"%d",(ulong)(uint)width);
  deSprintf(local_58,0x20,"%d",(ulong)(uint)height);
  local_158.name = "Name";
  local_158.type = QP_XML_ATTRIBUTE_STRING;
  local_158.intValue = -0x2a6;
  local_158.boolValue = -1;
  local_138 = "Width";
  local_130 = 0;
  local_120 = 0xfffffffffffffd5a;
  local_118 = "Height";
  local_110 = 0;
  local_108 = local_58;
  local_100 = 0xfffffffffffffd5a;
  local_e8 = s_qpImageFormatMap[(int)imageFormat].string;
  local_f8 = "Format";
  local_f0 = 0;
  local_e0 = 0xfffffffffffffd5a;
  local_c8 = s_qpImageCompressionModeMap[(int)qVar1].string;
  local_d8 = "CompressionMode";
  local_d0 = 0;
  local_c0 = 0xfffffffffffffd5a;
  if (description == (char *)0x0) {
    iVar4 = 5;
  }
  else {
    local_b8 = "Description";
    local_b0 = 0;
    local_a0 = 0xfffffffffffffd5a;
    iVar4 = 6;
    local_a8 = description;
  }
  local_158.stringValue = name;
  local_128 = local_178;
  deMutex_lock(log->lock);
  dVar2 = qpXmlWriter_startElement(log->writer,"Image",iVar4,&local_158);
  if (((dVar2 == 0) || (dVar2 = qpXmlWriter_writeBase64(log->writer,data_00,local_1c0), dVar2 == 0))
     || (dVar2 = qpXmlWriter_endElement(log->writer,"Image"), dVar2 == 0)) {
    dVar2 = 0;
    qpPrintf("qpTestLog_writeImage(): Writing XML failed\n");
    deMutex_unlock(log->lock);
  }
  else {
    deMutex_unlock(log->lock);
    dVar2 = 1;
  }
LAB_00214513:
  deFree(local_1a8.data);
  return dVar2;
}

Assistant:

deBool qpTestLog_writeImage	(
	qpTestLog*				log,
	const char*				name,
	const char*				description,
	qpImageCompressionMode	compressionMode,
	qpImageFormat			imageFormat,
	int						width,
	int						height,
	int						stride,
	const void*				data)
{
	char			widthStr[32];
	char			heightStr[32];
	qpXmlAttribute	attribs[8];
	int				numAttribs			= 0;
	Buffer			compressedBuffer;
	const void*		writeDataPtr		= DE_NULL;
	size_t			writeDataBytes		= ~(size_t)0;

	DE_ASSERT(log && name);
	DE_ASSERT(deInRange32(width, 1, 16384));
	DE_ASSERT(deInRange32(height, 1, 16384));
	DE_ASSERT(data);

	if (log->flags & QP_TEST_LOG_EXCLUDE_IMAGES)
		return DE_TRUE; /* Image not logged. */

	Buffer_init(&compressedBuffer);

	/* BEST compression mode defaults to PNG. */
	if (compressionMode == QP_IMAGE_COMPRESSION_MODE_BEST)
	{
#if defined(QP_SUPPORT_PNG)
		compressionMode = QP_IMAGE_COMPRESSION_MODE_PNG;
#else
		compressionMode = QP_IMAGE_COMPRESSION_MODE_NONE;
#endif
	}

#if defined(QP_SUPPORT_PNG)
	/* Try storing with PNG compression. */
	if (compressionMode == QP_IMAGE_COMPRESSION_MODE_PNG)
	{
		deBool compressOk = compressImagePNG(&compressedBuffer, imageFormat, width, height, stride, data);
		if (compressOk)
		{
			writeDataPtr	= compressedBuffer.data;
			writeDataBytes	= compressedBuffer.size;
		}
		else
		{
			/* Fall-back to default compression. */
			qpPrintf("WARNING: PNG compression failed -- storing image uncompressed.\n");
			compressionMode	= QP_IMAGE_COMPRESSION_MODE_NONE;
		}
	}
#endif

	/* Handle image compression. */
	switch (compressionMode)
	{
		case QP_IMAGE_COMPRESSION_MODE_NONE:
		{
			int pixelSize		= imageFormat == QP_IMAGE_FORMAT_RGB888 ? 3 : 4;
			int packedStride	= pixelSize*width;

			if (packedStride == stride)
				writeDataPtr = data;
			else
			{
				/* Need to re-pack pixels. */
				if (Buffer_resize(&compressedBuffer, (size_t)(packedStride*height)))
				{
					int row;
					for (row = 0; row < height; row++)
						memcpy(&compressedBuffer.data[packedStride*row], &((const deUint8*)data)[row*stride], (size_t)(pixelSize*width));
				}
				else
				{
					qpPrintf("ERROR: Failed to pack pixels for writing.\n");
					Buffer_deinit(&compressedBuffer);
					return DE_FALSE;
				}
			}

			writeDataBytes = (size_t)(packedStride*height);
			break;
		}

#if defined(QP_SUPPORT_PNG)
		case QP_IMAGE_COMPRESSION_MODE_PNG:
			DE_ASSERT(writeDataPtr); /* Already handled. */
			break;
#endif

		default:
			qpPrintf("qpTestLog_writeImage(): Unknown compression mode: %s\n", QP_LOOKUP_STRING(s_qpImageCompressionModeMap, compressionMode));
			Buffer_deinit(&compressedBuffer);
			return DE_FALSE;
	}

	/* Fill in attributes. */
	int32ToString(width, widthStr);
	int32ToString(height, heightStr);
	attribs[numAttribs++] = qpSetStringAttrib("Name", name);
	attribs[numAttribs++] = qpSetStringAttrib("Width", widthStr);
	attribs[numAttribs++] = qpSetStringAttrib("Height", heightStr);
	attribs[numAttribs++] = qpSetStringAttrib("Format", QP_LOOKUP_STRING(s_qpImageFormatMap, imageFormat));
	attribs[numAttribs++] = qpSetStringAttrib("CompressionMode", QP_LOOKUP_STRING(s_qpImageCompressionModeMap, compressionMode));
	if (description) attribs[numAttribs++] = qpSetStringAttrib("Description", description);

	/* \note Log lock is acquired after compression! */
	deMutex_lock(log->lock);

	/* <Image ID="result" Name="Foobar" Width="640" Height="480" Format="RGB888" CompressionMode="None">base64 data</Image> */
	if (!qpXmlWriter_startElement(log->writer, "Image", numAttribs, attribs) ||
		!qpXmlWriter_writeBase64(log->writer, (const deUint8*)writeDataPtr, writeDataBytes) ||
		!qpXmlWriter_endElement(log->writer, "Image"))
	{
		qpPrintf("qpTestLog_writeImage(): Writing XML failed\n");
		deMutex_unlock(log->lock);
		Buffer_deinit(&compressedBuffer);
		return DE_FALSE;
	}

	deMutex_unlock(log->lock);

	/* Free compressed data if allocated. */
	Buffer_deinit(&compressedBuffer);

	return DE_TRUE;
}